

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O0

bool anon_unknown.dwarf_157a4::equal<unsigned_int>(uint x,uint y)

{
  uint y_local;
  uint x_local;
  
  return x == y;
}

Assistant:

bool equal(float x, float y)
    {
        float r = x-y;
        if (r < 0)
            r = y-x;
        if (r < epsilon<float>())
            return true;
        return false;
    }